

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O2

void KEY_OFF(YM2151Operator *op,UINT32 key_clr)

{
  uint uVar1;
  
  if (((op->key != 0) && (uVar1 = op->key & ~key_clr, op->key = uVar1, uVar1 == 0)) &&
     (1 < op->state)) {
    op->state = 1;
    return;
  }
  return;
}

Assistant:

INLINE void KEY_OFF(channel_ *CH, int nsl)
{
  slot_ *SL = &(CH->SLOT[nsl]); // on recupère le bon pointeur de slot

  if (SL->Ecurp != RELEASE)     // la touche est-elle appuyée ?
  {
    if (SL->Ecnt < ENV_DECAY)   // attack phase ?
    {
      SL->Ecnt = (ENV_TAB[SL->Ecnt >> ENV_LBITS] << ENV_LBITS) + ENV_DECAY;
    }

    SL->Einc = SL->EincR;
    SL->Ecmp = ENV_END;
    SL->Ecurp = RELEASE;
  }
}